

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_SetPointerPluginTest_installTwoFunctionPointer_TestShell::createTest
          (TEST_SetPointerPluginTest_installTwoFunctionPointer_TestShell *this)

{
  TEST_SetPointerPluginTest_installTwoFunctionPointer_Test *this_00;
  
  this_00 = (TEST_SetPointerPluginTest_installTwoFunctionPointer_Test *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x4d);
  TEST_SetPointerPluginTest_installTwoFunctionPointer_Test::
  TEST_SetPointerPluginTest_installTwoFunctionPointer_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SetPointerPluginTest, installTwoFunctionPointer)
{
    FunctionPointerUtestShell *tst = new FunctionPointerUtestShell();

    fp1 = orig_func1;
    fp2 = orig_func2;
    myRegistry_->addTest(tst);
    myRegistry_->runAllTests(*result_);
    CHECK(fp1 == orig_func1);
    CHECK(fp2 == orig_func2);
    LONGS_EQUAL(0, result_->getFailureCount());
    LONGS_EQUAL(2, result_->getCheckCount());
    delete tst;
}